

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata.cc
# Opt level: O2

void __thiscall ProfileData::Add(ProfileData *this,int depth,void **stack)

{
  long lVar1;
  Entry *pEVar2;
  void **ppvVar3;
  int i;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  Entry *e;
  Entry *entry;
  ulong uVar9;
  
  if (-1 < this->out_) {
    uVar4 = 0xfe;
    if (depth < 0xfe) {
      uVar4 = depth;
    }
    if (depth < 1) {
      syscall(1,2,"Check failed: depth > 0: ProfileData::Add depth <= 0\n",0x35);
      abort();
    }
    uVar9 = (ulong)uVar4;
    uVar6 = 0;
    for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      uVar6 = (uVar6 << 8 | uVar6 >> 0x38) + (long)stack[uVar5] * 0x29;
    }
    this->count_ = this->count_ + 1;
    uVar5 = (ulong)(((uint)uVar6 & 0x3ff) << 0xd);
    pEVar2 = (Entry *)((long)this->hash_->entry[0].stack + (uVar5 - 0x10));
    lVar7 = (long)this->hash_->entry[0].stack + uVar5;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      if (pEVar2[lVar8].depth == uVar9) {
        uVar5 = 0;
        do {
          if (uVar9 == uVar5) {
            pEVar2[lVar8].count = pEVar2[lVar8].count + 1;
            return;
          }
          lVar1 = uVar5 * 8;
          ppvVar3 = stack + uVar5;
          uVar5 = uVar5 + 1;
        } while (*(void **)(lVar7 + lVar1) == *ppvVar3);
      }
      lVar7 = lVar7 + 0x800;
    }
    entry = pEVar2;
    for (lVar7 = 0x800; lVar7 != 0x2000; lVar7 = lVar7 + 0x800) {
      if (*(ulong *)((long)pEVar2->stack + lVar7 + -0x10) < entry->count) {
        entry = (Entry *)((long)pEVar2->stack + lVar7 + -0x10);
      }
    }
    if (entry->count != 0) {
      this->evictions_ = this->evictions_ + 1;
      Evict(this,entry);
    }
    entry->depth = uVar9;
    entry->count = 1;
    for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      entry->stack[uVar5] = (Slot)stack[uVar5];
    }
  }
  return;
}

Assistant:

void ProfileData::Add(int depth, const void* const* stack) {
  if (!enabled()) {
    return;
  }

  if (depth > kMaxStackDepth) depth = kMaxStackDepth;
  RAW_CHECK(depth > 0, "ProfileData::Add depth <= 0");

  // Make hash-value
  Slot h = 0;
  for (int i = 0; i < depth; i++) {
    Slot slot = reinterpret_cast<Slot>(stack[i]);
    h = (h << 8) | (h >> (8*(sizeof(h)-1)));
    h += (slot * 31) + (slot * 7) + (slot * 3);
  }

  count_++;

  // See if table already has an entry for this trace
  bool done = false;
  Bucket* bucket = &hash_[h % kBuckets];
  for (int a = 0; a < kAssociativity; a++) {
    Entry* e = &bucket->entry[a];
    if (e->depth == depth) {
      bool match = true;
      for (int i = 0; i < depth; i++) {
        if (e->stack[i] != reinterpret_cast<Slot>(stack[i])) {
          match = false;
          break;
        }
      }
      if (match) {
        e->count++;
        done = true;
        break;
      }
    }
  }

  if (!done) {
    // Evict entry with smallest count
    Entry* e = &bucket->entry[0];
    for (int a = 1; a < kAssociativity; a++) {
      if (bucket->entry[a].count < e->count) {
        e = &bucket->entry[a];
      }
    }
    if (e->count > 0) {
      evictions_++;
      Evict(*e);
    }

    // Use the newly evicted entry
    e->depth = depth;
    e->count = 1;
    for (int i = 0; i < depth; i++) {
      e->stack[i] = reinterpret_cast<Slot>(stack[i]);
    }
  }
}